

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<int_*,_10>::TPZManVector(TPZManVector<int_*,_10> *this,int64_t size,int **copy)

{
  int *piVar1;
  int **ppiVar2;
  long lVar3;
  
  TPZVec<int_*>::TPZVec(&this->super_TPZVec<int_*>,0);
  (this->super_TPZVec<int_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a098;
  if (size < 0xb) {
    (this->super_TPZVec<int_*>).fStore = this->fExtAlloc;
    (this->super_TPZVec<int_*>).fNElements = size;
    (this->super_TPZVec<int_*>).fNAlloc = 0;
    if (size < 1) {
      return;
    }
  }
  else {
    ppiVar2 = (int **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    (this->super_TPZVec<int_*>).fStore = ppiVar2;
    (this->super_TPZVec<int_*>).fNElements = size;
    (this->super_TPZVec<int_*>).fNAlloc = size;
  }
  piVar1 = *copy;
  lVar3 = 0;
  do {
    (this->super_TPZVec<int_*>).fStore[lVar3] = piVar1;
    lVar3 = lVar3 + 1;
  } while (size != lVar3);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}